

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall kratos::IRVisitor::visit_root_s(IRVisitor *this,IRNode *root)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar3;
  
  (**root->_vptr_IRNode)(root,this);
  iVar1 = (*root->_vptr_IRNode[1])(root);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    uVar3 = 0;
    do {
      iVar1 = (*root->_vptr_IRNode[2])(root,uVar3);
      visit_root_s(this,(IRNode *)CONCAT44(extraout_var_00,iVar1));
      iVar2 = (*root->_vptr_IRNode[1])(root);
      if (uVar3 < CONCAT44(extraout_var_01,iVar2)) {
        iVar2 = (*root->_vptr_IRNode[2])(root,uVar3);
        uVar3 = uVar3 + ((IRNode *)CONCAT44(extraout_var_00,iVar1) ==
                        (IRNode *)CONCAT44(extraout_var_02,iVar2));
      }
      iVar1 = (*root->_vptr_IRNode[1])(root);
    } while (uVar3 < CONCAT44(extraout_var_03,iVar1));
  }
  return;
}

Assistant:

void IRVisitor::visit_root_s(kratos::IRNode *root) {
    root->accept(this);
    uint64_t count = 0;
    while (count < root->child_count()) {
        auto *child = root->get_child(count);
        visit_root_s(child);
        if (count < root->child_count() && child == root->get_child(count)) {
            count++;
        }
    }
}